

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O1

pair<const_slang::ast::Statement_*,_bool> __thiscall
slang::ast::CaseStatement::getKnownBranch(CaseStatement *this,EvalContext *context)

{
  pointer pIVar1;
  size_t sVar2;
  pointer ppEVar3;
  ValueRangeExpression *this_00;
  __index_type _Var4;
  logic_t lVar5;
  bool bVar6;
  int iVar7;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_01;
  Diagnostic *pDVar8;
  pointer pIVar9;
  char *pcVar10;
  CaseStatement *pCVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  pair<const_slang::ast::Statement_*,_bool> pVar15;
  string_view arg;
  SourceRange range;
  ConstantValue val;
  ConstantValue cv;
  Statement *local_c0;
  Type *local_a8;
  SourceLocation local_a0;
  SourceLocation local_98;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  Expression::eval((ConstantValue *)&local_58,this->expr,context);
  if (local_58._M_index == '\0') {
    if (this->expr->kind == TypeReference) {
      local_a8 = *(Type **)(this->expr + 1);
      goto LAB_00778e32;
    }
  }
  else {
    local_a8 = (Type *)0x0;
LAB_00778e32:
    sVar2 = (this->items)._M_extent._M_extent_value;
    if (sVar2 == 0) {
      bVar14 = true;
      local_c0 = (Statement *)0x0;
    }
    else {
      pIVar9 = (this->items)._M_ptr;
      pIVar1 = pIVar9 + sVar2;
      bVar14 = this->check - Unique < 2;
      local_c0 = (Statement *)0x0;
      local_98 = (SourceLocation)0x0;
      local_a0 = (SourceLocation)0x0;
      pCVar11 = this;
      do {
        sVar2 = (pIVar9->expressions)._M_extent._M_extent_value;
        iVar7 = 4;
        if (sVar2 != 0) {
          ppEVar3 = (pIVar9->expressions)._M_ptr;
          lVar13 = 0;
          do {
            this_00 = *(ValueRangeExpression **)((long)ppEVar3 + lVar13);
            if ((this_00->super_Expression).kind == ValueRange) {
              ValueRangeExpression::checkInside
                        ((ConstantValue *)&local_80,this_00,context,(ConstantValue *)&local_58);
              _Var4 = local_80._M_index;
              if (local_80._M_index != '\0') {
                this_01 = std::
                          get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                    ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                      *)&local_80);
                lVar5 = SVInt::reductionOr(this_01);
                pCVar11 = (CaseStatement *)
                          (ulong)((lVar5.value != '\0' && lVar5.value != 0x80) && lVar5.value != '@'
                                 );
              }
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage(&local_80);
              if (_Var4 == '\0') {
                bVar6 = false;
                iVar7 = 1;
              }
              else {
LAB_00778f86:
                if (((ulong)pCVar11 & 1) != 0) {
                  if (local_c0 == (Statement *)0x0) {
                    local_c0 = (pIVar9->stmt).ptr;
                    local_98 = (this_00->super_Expression).sourceRange.startLoc;
                    local_a0 = (this_00->super_Expression).sourceRange.endLoc;
                    iVar7 = 4;
                  }
                  else {
                    pDVar8 = EvalContext::addDiag
                                       (context,(DiagCode)0x3000c,
                                        (this_00->super_Expression).sourceRange);
                    pDVar8 = Diagnostic::operator<<(pDVar8,(ConstantValue *)&local_58);
                    range.endLoc = local_a0;
                    range.startLoc = local_98;
                    Diagnostic::addNote(pDVar8,(DiagCode)0xb0001,range);
                    iVar7 = 4;
                    bVar14 = false;
                  }
                  goto LAB_00779014;
                }
                iVar7 = 0;
                bVar6 = true;
              }
            }
            else {
              Expression::eval((ConstantValue *)&local_80,&this_00->super_Expression,context);
              if (local_80._M_index == '\0') {
                if ((local_a8 != (Type *)0x0) && ((this_00->super_Expression).kind == TypeReference)
                   ) {
                  bVar6 = Type::isMatching(*(Type **)&this_00->rangeKind,local_a8);
                  goto LAB_00778f4c;
                }
                bVar6 = false;
              }
              else {
                bVar6 = checkMatch(this->condition,(ConstantValue *)&local_58,
                                   (ConstantValue *)&local_80);
LAB_00778f4c:
                pCVar11 = (CaseStatement *)(ulong)bVar6;
                bVar6 = true;
              }
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage(&local_80);
              if (bVar6) goto LAB_00778f86;
              iVar7 = 1;
LAB_00779014:
              bVar6 = false;
            }
            if (!bVar6) goto LAB_00779042;
            lVar13 = lVar13 + 8;
          } while (sVar2 << 3 != lVar13);
          iVar7 = 4;
        }
LAB_00779042:
        if ((iVar7 == 4) && ((local_c0 == (Statement *)0x0 || (iVar7 = 2, bVar14)))) {
          iVar7 = 0;
        }
        if (iVar7 != 0) goto LAB_00779072;
        pIVar9 = pIVar9 + 1;
      } while (pIVar9 != pIVar1);
      iVar7 = 2;
LAB_00779072:
      bVar14 = iVar7 == 2;
    }
    if (bVar14) {
      if (local_c0 == (Statement *)0x0) {
        local_c0 = this->defaultCase;
      }
      uVar12 = CONCAT71((int7)((ulong)this >> 8),1);
      if ((local_c0 == (Statement *)0x0) && ((this->check | Unique0) == Priority)) {
        pDVar8 = EvalContext::addDiag(context,(DiagCode)0x13000c,this->expr->sourceRange);
        bVar14 = this->check == Priority;
        pcVar10 = "unique";
        if (bVar14) {
          pcVar10 = "priority";
        }
        arg._M_str = pcVar10;
        arg._M_len = (ulong)bVar14 * 2 + 6;
        Diagnostic::operator<<(pDVar8,arg);
        Diagnostic::operator<<(pDVar8,(ConstantValue *)&local_58);
      }
      goto LAB_00779105;
    }
  }
  local_c0 = (Statement *)0x0;
  uVar12 = 0;
LAB_00779105:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  pVar15._8_8_ = uVar12 & 0xffffffff;
  pVar15.first = local_c0;
  return pVar15;
}

Assistant:

std::pair<const Statement*, bool> CaseStatement::getKnownBranch(EvalContext& context) const {
    const Type* condType = nullptr;
    auto cv = expr.eval(context);
    if (!cv) {
        if (expr.kind == ExpressionKind::TypeReference)
            condType = &expr.as<TypeReferenceExpression>().targetType;
        else
            return {nullptr, false};
    }

    const Statement* matchedStmt = nullptr;
    SourceRange matchRange;
    bool unique = check == UniquePriorityCheck::Unique || check == UniquePriorityCheck::Unique0;

    for (auto& group : items) {
        for (auto item : group.expressions) {
            bool matched;
            if (item->kind == ExpressionKind::ValueRange) {
                ConstantValue val = item->as<ValueRangeExpression>().checkInside(context, cv);
                if (!val)
                    return {nullptr, false};

                matched = (bool)(logic_t)val.integer();
            }
            else {
                auto val = item->eval(context);
                if (val)
                    matched = checkMatch(condition, cv, val);
                else if (condType && item->kind == ExpressionKind::TypeReference)
                    matched = item->as<TypeReferenceExpression>().targetType.isMatching(*condType);
                else
                    return {nullptr, false};
            }

            if (matched) {
                // If we already matched with a previous item, the only we reason
                // we'd still get here is to check for uniqueness. The presence of
                // another match means we failed the uniqueness check.
                if (matchedStmt) {
                    auto& diag =
                        context.addDiag(diag::ConstEvalCaseItemsNotUnique, item->sourceRange) << cv;
                    diag.addNote(diag::NotePreviousMatch, matchRange);
                    unique = false;
                }
                else {
                    // Always break out of the item group once we find a match -- even when
                    // checking uniqueness, expressions in a single group are not required
                    // to be unique.
                    matchedStmt = group.stmt;
                    matchRange = item->sourceRange;
                }
                break;
            }
        }

        if (matchedStmt && !unique)
            break;
    }

    if (!matchedStmt)
        matchedStmt = defaultCase;

    if (!matchedStmt &&
        (check == UniquePriorityCheck::Priority || check == UniquePriorityCheck::Unique)) {

        auto& diag = context.addDiag(diag::ConstEvalNoCaseItemsMatched, expr.sourceRange);
        diag << (check == UniquePriorityCheck::Priority ? "priority"sv : "unique"sv);
        diag << cv;
    }

    return {matchedStmt, true};
}